

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.hpp
# Opt level: O2

ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
* __thiscall
memory::
ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
::operator=(ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
            *this,vector<int,_std::allocator<int>_> *other)

{
  pointer __src;
  pointer piVar1;
  size_t __n;
  
  __src = (other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  piVar1 = (other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  __n = (long)piVar1 - (long)__src;
  if ((long)__n >> 2 == *(long *)(this + 0x10)) {
    if (piVar1 != __src) {
      memmove(*(void **)(this + 8),__src,__n);
    }
    return (ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *)this;
  }
  __assert_fail("other.size()==size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                ,0x2e7,
                "ArrayReference<T, Coord> &memory::ArrayReference<int, memory::HostCoordinator<int>>::operator=(const std::vector<value_type, Allocator> &) [T = int, Coord = memory::HostCoordinator<int>, Allocator = std::allocator<int>]"
               );
}

Assistant:

ArrayReference& operator=(const std::vector<value_type, Allocator>& other)
    {
        assert(other.size()==size());
#if VERBOSE>1
        std::cerr << util::pretty_printer<ArrayReference>::print(*this)
                  << "::" << util::blue("operator=") << "(std::vector(" << other.size() << "))"
                  << std::endl;
#endif
        // there is a kink in the coordinator, so use std::copy directly, because we know
        // that coordinator_type is_malloc_compatible
        //base::coordinator_.copy(base(other.data(), other.size(), this);
        std::copy(other.begin(), other.end(), base::data());
        return *this;
    }